

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O0

void nhdp_db_neighbor_remove(nhdp_neighbor *neigh)

{
  oonf_log_source oVar1;
  undefined8 uVar2;
  list_entity *plVar3;
  list_entity *plVar4;
  list_entity *__tempptr_10;
  list_entity *__tempptr_9;
  list_entity *__tempptr_8;
  list_entity *__tempptr_7;
  list_entity *__tempptr_6;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  _Bool was_mpr;
  netaddr_str nbuf;
  nhdp_domain *domain;
  nhdp_link *l_it;
  nhdp_link *lnk;
  nhdp_naddr *na_it;
  nhdp_naddr *naddr;
  nhdp_neighbor_domaindata *neighdata;
  nhdp_neighbor *neigh_local;
  
  oVar1 = LOG_NHDP;
  if (((&log_global_mask)[LOG_NHDP] & 1) != 0) {
    uVar2 = netaddr_to_prefixstring((long)&__tempptr + 2,neigh,0);
    oonf_log(1,oVar1,"src/nhdp/nhdp/nhdp_db.c",0xf4,0,0,"Remove Neighbor: 0x%0zx (%s)",neigh,uVar2);
  }
  oonf_class_event(&_neigh_info,neigh,2);
  nhdp_db_neigbor_disconnect_dualstack(neigh);
  plVar3 = (neigh->_links).next;
  l_it = (nhdp_link *)&plVar3[-0x20].prev;
  plVar3 = plVar3->next;
  while( true ) {
    domain = (nhdp_domain *)&plVar3[-0x20].prev;
    if ((l_it->_neigh_node).prev == (neigh->_links).prev) break;
    nhdp_db_link_remove(l_it);
    l_it = (nhdp_link *)domain;
    plVar3 = plVar3->next;
  }
  plVar3 = (neigh->_neigh_addresses).list_head.next;
  na_it = (nhdp_naddr *)&plVar3[-9].prev;
  plVar3 = plVar3->next;
  while( true ) {
    lnk = (nhdp_link *)&plVar3[-9].prev;
    if ((na_it->_neigh_node).list.prev == (neigh->_neigh_addresses).list_head.prev) break;
    nhdp_db_neighbor_addr_remove(na_it);
    na_it = (nhdp_naddr *)lnk;
    plVar3 = plVar3->next;
  }
  if ((neigh->originator)._type != '\0') {
    avl_remove(&_neigh_originator_tree,&neigh->_originator_node);
  }
  __tempptr._1_1_ = 0;
  plVar3 = nhdp_domain_get_list();
  plVar3 = plVar3->next;
  do {
    nbuf.buf._54_8_ = plVar3 + -0x2a;
    plVar3 = plVar3->prev;
    plVar4 = nhdp_domain_get_list();
    if (plVar3 == plVar4->prev) {
LAB_00105913:
      if ((__tempptr._1_1_ & 1) != 0) {
        nhdp_domain_delayed_mpr_recalculation((nhdp_domain *)0x0,neigh);
      }
      plVar3 = (neigh->_global_node).prev;
      plVar4 = (neigh->_global_node).next;
      plVar3->next = plVar4;
      plVar4->prev = plVar3;
      (neigh->_global_node).prev = (list_entity *)0x0;
      (neigh->_global_node).next = (list_entity *)0x0;
      oonf_class_free(&_neigh_info,neigh);
      return;
    }
    if ((neigh->_domaindata[*(int *)(nbuf.buf._54_8_ + 0x34)].neigh_is_mpr & 1U) != 0) {
      __tempptr._1_1_ = 1;
      goto LAB_00105913;
    }
    plVar3 = *(list_entity **)(nbuf.buf._54_8_ + 0x2a0);
  } while( true );
}

Assistant:

void
nhdp_db_neighbor_remove(struct nhdp_neighbor *neigh) {
  struct nhdp_neighbor_domaindata *neighdata;
  struct nhdp_naddr *naddr, *na_it;
  struct nhdp_link *lnk, *l_it;
  struct nhdp_domain *domain;
#ifdef OONF_LOG_DEBUG_INFO
  struct netaddr_str nbuf;
#endif
  bool was_mpr;

  OONF_DEBUG(LOG_NHDP, "Remove Neighbor: 0x%0zx (%s)", (size_t)neigh, netaddr_to_string(&nbuf, &neigh->originator));

  /* trigger event */
  oonf_class_event(&_neigh_info, neigh, OONF_OBJECT_REMOVED);

  /* disconnect from other IP version */
  nhdp_db_neigbor_disconnect_dualstack(neigh);

  /* remove all links */
  list_for_each_element_safe(&neigh->_links, lnk, _neigh_node, l_it) {
    nhdp_db_link_remove(lnk);
  }

  /* remove all neighbor addresses */
  avl_for_each_element_safe(&neigh->_neigh_addresses, naddr, _neigh_node, na_it) {
    nhdp_db_neighbor_addr_remove(naddr);
  }

  /* remove from originator tree if necessary */
  if (netaddr_get_address_family(&neigh->originator) != AF_UNSPEC) {
    avl_remove(&_neigh_originator_tree, &neigh->_originator_node);
  }

  /* check if neighbor was a MPR */
  was_mpr = false;
  list_for_each_element(nhdp_domain_get_list(), domain, _node) {
    neighdata = nhdp_domain_get_neighbordata(domain, neigh);
    if (neighdata->neigh_is_mpr) {
      was_mpr = true;
      break;
    }
  }

  if (was_mpr) {
    /* all domains might have changed */
    nhdp_domain_delayed_mpr_recalculation(NULL, neigh);
  }

  /* remove from global list and free memory */
  list_remove(&neigh->_global_node);
  oonf_class_free(&_neigh_info, neigh);
}